

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleBuilder.cpp
# Opt level: O1

bool __thiscall Refal2::CModuleBuilder::checkModuleExist(CModuleBuilder *this,CToken *token)

{
  bool bVar1;
  string local_48;
  
  bVar1 = true;
  if ((this->module)._M_t.
      super___uniq_ptr_impl<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>._M_t.
      super__Tuple_impl<0UL,_Refal2::CModuleData_*,_std::default_delete<Refal2::CModuleData>_>.
      super__Head_base<0UL,_Refal2::CModuleData_*,_false>._M_head_impl == (CModuleData *)0x0) {
    if (this->isAnonymousModule == true) {
      createModule(this);
    }
    else {
      bVar1 = false;
    }
  }
  if (!bVar1) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"Wrong function declaration out of module","");
    CErrorsHelper::RaiseError((CErrorsHelper *)this,ES_FatalError,&local_48,token);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
  return bVar1;
}

Assistant:

bool CModuleBuilder::checkModuleExist( const CToken& token )
{
	if( attemptModule() ) {
		return true;
	}
	fatalError( token, "Wrong function declaration out of module" );
	return false;
}